

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsLoads.h
# Opt level: O1

void __thiscall chrono::ChShaftsElasticGear::~ChShaftsElasticGear(ChShaftsElasticGear *this)

{
  ChLoadCustomMultiple::~ChLoadCustomMultiple(&this->super_ChLoadCustomMultiple);
  operator_delete(this,0x98);
  return;
}

Assistant:

class ChApi ChShaftsElasticGear : public ChLoadCustomMultiple {
  public:
    ChShaftsElasticGear(
        std::shared_ptr<ChShaft> mbodyA,  ///< shaft A
        std::shared_ptr<ChShaft> mbodyB,  ///< shaft B
        const double mstiffness,          ///< normal stiffness at teeth contact, tangent direction to primitive
        const double mdamping,            ///< normal damping at teeth contact, tangent direction to primitive
        const double mRa,                 ///< primitive radius of the gear on shaft A (the radius of B is not needed)
        const double mratio = -1          ///< transmission ratio (negative for outer gear, positive for inner gears)
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChShaftsElasticGear* Clone() const override { return new ChShaftsElasticGear(*this); }

    /// Set teeth stiffness, at contact point, in tangent direction to the two primitives. Es. [N/m]
    void SetTeethStiffness(const double mstiffness) { stiffness = mstiffness; }
    double GetTeethStiffness() const { return stiffness; }

    /// Set teeth damping, at contact point, in tangent direction to the two primitives. Es. [Ns/m]
    void SetTeethDamping(const double mdamping) { damping = mdamping; }
    double GetTeethDamping() const { return damping; }

    /// Set the phase shaftA-tau*shaftB for zero compression of the spring (default = 0 [rad])
    void SetRestPhase(const double mphase) { rest_phase = mphase; }
    double GetRestPhase() const { return rest_phase; }

    /// Set the transmission ratio t, as in w2=t*w1, or t=w2/w1 , or  t*w1 - w2 = 0.
    /// For example, t=1 for a rigid joint; t=-0.5 for representing
    /// a couple of spur gears with teeth z1=20 & z2=40; t=0.1 for
    /// a gear with inner teeth (or epicycloidal reducer), etc.
    /// Differently from the ideal ChShaftsGear constraint, this model includes
    /// elasticity, so at least the radius of one of the two gear wheels is needed, namely Ra.
    void SetTransmissionRatioAndRadiusA(double mt, double mRa) {
        ratio = mt;
        Ra = mRa;
    }

    /// Set the transmission ratio t, as in w2=t*w1, using the two primitive radii Ra and Rb.
    /// It will be computed as t=Ra/Rb by default, otherwise t=-Ra/Rb if the bigger wheel has inner teeth.
    void SetTransmissionRatioFromRadii(double mRa, double mRb, bool minternal = false) {
        Ra = mRa;
        ratio = fabs(mRa / mRb);
        if (minternal)
            ratio = -ratio;
    }

    /// Get the transmission ratio t, as in w2=t*w1, or t=w2/w1
    double GetTransmissionRatio() const { return ratio; }

    /// Get the primitive radius of the gear wheel of shaftA
    double GetGearRadiusA() const { return Ra; }

    /// Get the primitive radius of the gear wheel of shaftB
    double GetGearRadiusB() const { return Ra * fabs(1.0 / ratio); }

    /// Get the last computed contact force, for diagnostics.
    /// The force is assumed tangent to the primitives of the gear wheels,
    /// it can be positive or negative depending on clock/counterclock effect.
    double GetContactForce() const { return contact_force; }

  protected:
    double stiffness;
    double damping;
    double rest_phase;
    double Ra;
    double ratio;
    double contact_force;

    virtual bool IsStiff() override { return true; }

    /// Compute Q, the generalized load.
    /// Called automatically at each Update().
    virtual void ComputeQ(ChState* state_x,      ///< state position to evaluate Q
                          ChStateDelta* state_w  ///< state speed to evaluate Q
                          ) override;
}